

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledI2C.cxx
# Opt level: O0

void __thiscall SSD1306::OledI2C::unsetPixel(OledI2C *this,OledPoint p)

{
  OledPoint p_00;
  OledPoint p_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  reference pvVar5;
  int in_ESI;
  PixelOffset *in_RDI;
  PixelOffset po;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  byte local_24;
  
  p_00.m_y = in_stack_ffffffffffffffd4;
  p_00.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside((OledPixel *)in_RDI,p_00);
  if (bVar1) {
    p_01.m_y = in_ESI;
    p_01.m_x = in_stack_ffffffffffffffd0;
    anon_unknown.dwarf_6218::PixelOffset::PixelOffset(in_RDI,p_01);
    std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
              ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    pbVar4 = std::array<unsigned_char,_33UL>::operator[]
                       ((array<unsigned_char,_33UL> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (((uint)*pbVar4 & 1 << (local_24 & 0x1f)) != 0) {
      uVar2 = 1 << (local_24 & 0x1f);
      uVar3 = uVar2 ^ 0xffffffff;
      std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                 (CONCAT44(uVar2,in_stack_ffffffffffffffc0) ^ 0xffffffff00000000),
                 in_stack_ffffffffffffffb8);
      pbVar4 = std::array<unsigned_char,_33UL>::operator[]
                         ((array<unsigned_char,_33UL> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *pbVar4 = *pbVar4 & (byte)uVar3;
      pvVar5 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                         ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                          CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
      if ((pvVar5->dirty_ & 1U) == 0) {
        pvVar5 = std::array<SSD1306::OledI2C::PixelBlock,_32UL>::operator[]
                           ((array<SSD1306::OledI2C::PixelBlock,_32UL> *)
                            CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
        pvVar5->dirty_ = true;
      }
    }
  }
  return;
}

Assistant:

void
SSD1306::OledI2C::unsetPixel(
    SSD1306::OledPoint p)
{
    if (not pixelInside(p))
    {
        return;
    }

    PixelOffset po{p};

    if ((blocks_[po.block].bytes_[po.byte] & (1 << po.bit)) != 0)
    {
        blocks_[po.block].bytes_[po.byte] &= ~(1 << po.bit);

        if (not blocks_[po.block].dirty_)
        {
            blocks_[po.block].dirty_ = true;
        }
    }
}